

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

bool __thiscall MeCab::Writer::writeDump(Writer *this,Lattice *lattice,StringBuffer *os)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  StringBuffer *pSVar5;
  uint uVar6;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *extraout_RDX_01;
  void *pvVar7;
  void *__buf_14;
  void *__buf_15;
  void *extraout_RDX_02;
  long *plVar8;
  long lVar4;
  
  iVar2 = (*lattice->_vptr_Lattice[8])(lattice);
  iVar3 = (*lattice->_vptr_Lattice[2])(lattice);
  lVar4 = CONCAT44(extraout_var,iVar3);
  do {
    if (lVar4 == 0) {
      return true;
    }
    pSVar5 = StringBuffer::operator<<(os,*(uint *)(lVar4 + 0x40));
    StringBuffer::write(pSVar5,0x20,__buf,in_RCX);
    if (*(char *)(lVar4 + 0x4f) == '\x03') {
      iVar3 = 0x1503a2;
LAB_0012aeb6:
      StringBuffer::write(os,iVar3,__buf_00,in_RCX);
      pvVar7 = extraout_RDX;
    }
    else {
      if (*(char *)(lVar4 + 0x4f) == '\x02') {
        iVar3 = 0x15165a;
        goto LAB_0012aeb6;
      }
      StringBuffer::write(os,(int)*(undefined8 *)(lVar4 + 0x30),
                          (void *)(ulong)*(ushort *)(lVar4 + 0x44),in_RCX);
      pvVar7 = extraout_RDX_00;
    }
    pSVar5 = (StringBuffer *)StringBuffer::write(os,0x20,pvVar7,in_RCX);
    pSVar5 = (StringBuffer *)
             StringBuffer::write(pSVar5,(int)*(undefined8 *)(lVar4 + 0x38),__buf_01,in_RCX);
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_02,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,*(int *)(lVar4 + 0x30) - iVar2);
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_03,in_RCX);
    uVar6 = *(int *)(lVar4 + 0x30) - iVar2;
    in_RCX = (size_t)uVar6;
    pSVar5 = StringBuffer::operator<<(pSVar5,*(ushort *)(lVar4 + 0x44) + uVar6);
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_04,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,*(unsigned_short *)(lVar4 + 0x48));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_05,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,*(unsigned_short *)(lVar4 + 0x4a));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_06,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,*(unsigned_short *)(lVar4 + 0x4c));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_07,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,(uint)*(byte *)(lVar4 + 0x4e));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_08,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,(uint)*(byte *)(lVar4 + 0x4f));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_09,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,(uint)*(byte *)(lVar4 + 0x50));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_10,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,(double)*(float *)(lVar4 + 0x54));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_11,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,(double)*(float *)(lVar4 + 0x58));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_12,in_RCX);
    pSVar5 = StringBuffer::operator<<(pSVar5,(double)*(float *)(lVar4 + 0x5c));
    pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_13,in_RCX);
    StringBuffer::operator<<(pSVar5,*(long *)(lVar4 + 0x68));
    plVar8 = (long *)(lVar4 + 0x28);
    pvVar7 = extraout_RDX_01;
    while (lVar1 = *plVar8, lVar1 != 0) {
      pSVar5 = (StringBuffer *)StringBuffer::write(os,0x20,pvVar7,in_RCX);
      in_RCX = *(size_t *)(lVar1 + 0x10);
      pSVar5 = StringBuffer::operator<<(pSVar5,*(uint *)(in_RCX + 0x40));
      pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x3a,__buf_14,in_RCX);
      pSVar5 = StringBuffer::operator<<(pSVar5,*(int *)(lVar1 + 0x20));
      pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x3a,__buf_15,in_RCX);
      StringBuffer::operator<<(pSVar5,(double)*(float *)(lVar1 + 0x24));
      pvVar7 = extraout_RDX_02;
      plVar8 = (long *)(lVar1 + 0x18);
    }
    StringBuffer::write(os,10,pvVar7,in_RCX);
    lVar4 = *(long *)(lVar4 + 8);
  } while( true );
}

Assistant:

bool Writer::writeDump(Lattice *lattice, StringBuffer *os) const {
  const char *str = lattice->sentence();
  for (const Node *node = lattice->bos_node(); node; node = node->next) {
    *os << node->id << ' ';
    if (node->stat == MECAB_BOS_NODE) {
      *os << "BOS";
    } else if (node->stat == MECAB_EOS_NODE) {
      *os << "EOS";
    } else {
      os->write(node->surface, node->length);
    }

    *os << ' ' << node->feature
        << ' ' << static_cast<int>(node->surface - str)
        << ' ' << static_cast<int>(node->surface - str + node->length)
        << ' ' << node->rcAttr
        << ' ' << node->lcAttr
        << ' ' << node->posid
        << ' ' << static_cast<int>(node->char_type)
        << ' ' << static_cast<int>(node->stat)
        << ' ' << static_cast<int>(node->isbest)
        << ' ' << node->alpha
        << ' ' << node->beta
        << ' ' << node->prob
        << ' ' << node->cost;

    for (const Path *path = node->lpath; path; path = path->lnext) {
      *os << ' ' << path->lnode->id << ':' << path->cost << ':' << path->prob;
    }
    *os << '\n';
  }
  return true;
}